

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O3

iterator llvm::yaml::begin<llvm::yaml::SequenceNode>(SequenceNode *C)

{
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> local_18;
  iterator ret;
  
  if (C->IsAtBeginning != false) {
    C->IsAtBeginning = false;
    local_18.Base = C;
    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++(&local_18);
    return (iterator)local_18.Base;
  }
  __assert_fail("C.IsAtBeginning && \"You may only iterate over a collection once!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                ,0x17d,
                "typename CollectionType::iterator llvm::yaml::begin(CollectionType &) [CollectionType = llvm::yaml::SequenceNode]"
               );
}

Assistant:

typename CollectionType::iterator begin(CollectionType &C) {
  assert(C.IsAtBeginning && "You may only iterate over a collection once!");
  C.IsAtBeginning = false;
  typename CollectionType::iterator ret(&C);
  ++ret;
  return ret;
}